

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_self_test(int verbose)

{
  int iVar1;
  uint32_t flags;
  mbedtls_x509_crt clicert;
  mbedtls_x509_crt cacert;
  uint32_t local_46c;
  mbedtls_x509_crt local_468;
  mbedtls_x509_crt local_240;
  
  if (verbose != 0) {
    printf("  X.509 certificate load: ");
  }
  mbedtls_x509_crt_init(&local_468);
  iVar1 = mbedtls_x509_crt_parse(&local_468,(uchar *)mbedtls_test_cli_crt,0x4b9);
  if (iVar1 == 0) {
    mbedtls_x509_crt_init(&local_240);
    iVar1 = mbedtls_x509_crt_parse(&local_240,(uchar *)mbedtls_test_ca_crt,0x51b);
    if (iVar1 == 0) {
      if (verbose != 0) {
        printf("passed\n  X.509 signature verify: ");
      }
      iVar1 = mbedtls_x509_crt_verify
                        (&local_468,&local_240,(mbedtls_x509_crl *)0x0,(char *)0x0,&local_46c,
                         (_func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *)0x0,(void *)0x0
                        );
      if (iVar1 == 0) {
        if (verbose != 0) {
          puts("passed\n");
        }
        mbedtls_x509_crt_free(&local_240);
        mbedtls_x509_crt_free(&local_468);
        return 0;
      }
    }
  }
  if (verbose != 0) {
    puts("failed");
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_self_test( int verbose )
{
#if defined(MBEDTLS_CERTS_C) && defined(MBEDTLS_SHA1_C)
    int ret;
    uint32_t flags;
    mbedtls_x509_crt cacert;
    mbedtls_x509_crt clicert;

    if( verbose != 0 )
        mbedtls_printf( "  X.509 certificate load: " );

    mbedtls_x509_crt_init( &clicert );

    ret = mbedtls_x509_crt_parse( &clicert, (const unsigned char *) mbedtls_test_cli_crt,
                           mbedtls_test_cli_crt_len );
    if( ret != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        return( ret );
    }

    mbedtls_x509_crt_init( &cacert );

    ret = mbedtls_x509_crt_parse( &cacert, (const unsigned char *) mbedtls_test_ca_crt,
                          mbedtls_test_ca_crt_len );
    if( ret != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        return( ret );
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n  X.509 signature verify: ");

    ret = mbedtls_x509_crt_verify( &clicert, &cacert, NULL, NULL, &flags, NULL, NULL );
    if( ret != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        return( ret );
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n\n");

    mbedtls_x509_crt_free( &cacert  );
    mbedtls_x509_crt_free( &clicert );

    return( 0 );
#else
    ((void) verbose);
    return( 0 );
#endif /* MBEDTLS_CERTS_C && MBEDTLS_SHA1_C */
}